

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O3

void __thiscall apngasm::APNGAsm::dirtyTransparencyOptimization(APNGAsm *this,uchar coltype)

{
  uchar *puVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  undefined7 in_register_00000031;
  pointer pAVar5;
  long lVar6;
  pointer pAVar7;
  uint uVar8;
  
  iVar4 = (int)CONCAT71(in_register_00000031,coltype);
  if (iVar4 == 6) {
    pAVar5 = (this->_frames).
             super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
             super__Vector_impl_data._M_start;
    pAVar7 = (this->_frames).
             super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pAVar7 != pAVar5) {
      uVar3 = this->_size;
      uVar2 = 0;
      uVar8 = uVar3;
      do {
        if (uVar8 == 0) {
          uVar8 = 0;
        }
        else {
          puVar1 = pAVar5[uVar2]._pixels;
          lVar6 = 0;
          do {
            if (puVar1[lVar6 * 4 + 3] == '\0') {
              puVar1[lVar6 * 4 + 2] = '\0';
              (puVar1 + lVar6 * 4)[0] = '\0';
              (puVar1 + lVar6 * 4)[1] = '\0';
              uVar3 = this->_size;
            }
            lVar6 = lVar6 + 1;
          } while ((uint)lVar6 < uVar3);
          pAVar5 = (this->_frames).
                   super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pAVar7 = (this->_frames).
                   super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          uVar8 = uVar3;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < (ulong)(((long)pAVar7 - (long)pAVar5 >> 4) * -0xf4898d5f85bb395));
    }
  }
  else if (iVar4 == 4) {
    pAVar5 = (this->_frames).
             super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
             super__Vector_impl_data._M_start;
    pAVar7 = (this->_frames).
             super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pAVar7 != pAVar5) {
      uVar3 = this->_size;
      uVar2 = 0;
      uVar8 = uVar3;
      do {
        if (uVar8 == 0) {
          uVar8 = 0;
        }
        else {
          puVar1 = pAVar5[uVar2]._pixels;
          lVar6 = 0;
          do {
            if (puVar1[lVar6 * 2 + 1] == '\0') {
              puVar1[lVar6 * 2] = '\0';
              uVar3 = this->_size;
            }
            lVar6 = lVar6 + 1;
          } while ((uint)lVar6 < uVar3);
          pAVar5 = (this->_frames).
                   super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pAVar7 = (this->_frames).
                   super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          uVar8 = uVar3;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < (ulong)(((long)pAVar7 - (long)pAVar5 >> 4) * -0xf4898d5f85bb395));
    }
  }
  return;
}

Assistant:

void APNGAsm::dirtyTransparencyOptimization(unsigned char coltype)
  {
    if (coltype == 6)
    {
      for (size_t n = 0; n < _frames.size(); ++n)
      {
        unsigned char * sp = _frames[n]._pixels;
        for (unsigned int j=0; j<_size; j++, sp+=4)
          if (sp[3] == 0)
             sp[0] = sp[1] = sp[2] = 0;
      }
    }
    else
    if (coltype == 4)
    {
      for (size_t n = 0; n < _frames.size(); ++n)
      {
        unsigned char * sp = _frames[n]._pixels;
        for (unsigned int j=0; j<_size; j++, sp+=2)
          if (sp[1] == 0)
            sp[0] = 0;
      }
    }
  }